

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O3

void Ptex::v2_2::(anonymous_namespace)::ApplyS<unsigned_char,3>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int nTxChan)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  int iVar6;
  byte *pbVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  iVar6 = k->v1;
  iVar2 = k->v2;
  if (iVar6 != iVar2) {
    fVar1 = k->A;
    do {
      iVar4 = k->rowlen - iVar6;
      iVar3 = iVar4 - k->w2;
      if (iVar3 < k->u1) {
        iVar3 = k->u1;
      }
      iVar4 = iVar4 - k->w1;
      if (k->u2 < iVar4) {
        iVar4 = k->u2;
      }
      iVar4 = (iVar4 - iVar3) * nTxChan;
      if (0 < iVar4) {
        pbVar7 = (byte *)((long)((k->rowlen * iVar6 + iVar3) * nTxChan) + (long)data);
        pbVar5 = pbVar7 + iVar4;
        fVar9 = (float)iVar3 - k->u;
        fVar8 = (float)iVar6 - k->v;
        fVar10 = fVar9 * k->A * fVar9 + (k->B * fVar9 + k->C * fVar8) * fVar8;
        fVar8 = (fVar9 + fVar9 + 1.0) * k->A + fVar8 * k->B;
        do {
          if (fVar10 < 1.0) {
            fVar9 = expf(fVar10 * -6.125);
            fVar9 = fVar9 * k->wscale;
            k->weight = k->weight + fVar9;
            *result = (float)*pbVar7 * fVar9 + *result;
            result[1] = (float)pbVar7[1] * fVar9 + result[1];
            result[2] = (float)pbVar7[2] * fVar9 + result[2];
          }
          fVar10 = fVar10 + fVar8;
          fVar8 = fVar8 + fVar1 + fVar1;
          pbVar7 = pbVar7 + nTxChan;
        } while (pbVar7 < pbVar5);
        iVar2 = k->v2;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != iVar2);
  }
  return;
}

Assistant:

void ApplyS(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int nTxChan)
    {
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }